

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O1

FT_Error PCF_Size_Select(FT_Size size,FT_ULong strike_index)

{
  FT_Face face;
  long lVar1;
  
  face = size->face;
  FT_Select_Metrics(face,strike_index);
  lVar1._0_2_ = face[1].units_per_EM;
  lVar1._2_2_ = face[1].ascender;
  lVar1._4_2_ = face[1].descender;
  lVar1._6_2_ = face[1].height;
  (size->metrics).ascender = lVar1 << 6;
  (size->metrics).descender = *(long *)&face[1].max_advance_width * -0x40;
  (size->metrics).max_advance = (long)*(short *)((long)&face[1].memory + 4) << 6;
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  PCF_Size_Select( FT_Size   size,
                   FT_ULong  strike_index )
  {
    PCF_Accel  accel = &( (PCF_Face)size->face )->accel;


    FT_Select_Metrics( size->face, strike_index );

    size->metrics.ascender    =  accel->fontAscent * 64;
    size->metrics.descender   = -accel->fontDescent * 64;
    size->metrics.max_advance =  accel->maxbounds.characterWidth * 64;

    return FT_Err_Ok;
  }